

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool slang::ast::checkPackedUnionTag
               (Type *valueType,SVInt *val,uint32_t expectedTag,EvalContext *context,
               SourceRange sourceRange,string_view memberName)

{
  string_view arg;
  SourceRange range;
  PackedUnionType *pPVar1;
  _Optional_payload_base<unsigned_int> _Var2;
  uint *puVar3;
  uint in_EDX;
  SVInt *in_RSI;
  optional<unsigned_int> tag;
  bitwidth_t bits;
  uint32_t tagBits;
  optional<unsigned_int> *this;
  SVInt *this_00;
  SVInt *in_stack_ffffffffffffff78;
  Diagnostic *in_stack_ffffffffffffffa0;
  _Optional_payload_base<unsigned_int> in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffb0;
  DiagCode code;
  
  this_00 = (SVInt *)&stack0x00000008;
  pPVar1 = Symbol::as<slang::ast::PackedUnionType>((Symbol *)0x86275a);
  code = (DiagCode)pPVar1->tagBits;
  if (code != (DiagCode)0x0) {
    SVInt::getBitWidth(in_RSI);
    this = (optional<unsigned_int> *)&stack0xffffffffffffffa8;
    SVInt::slice(_bits,tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._4_4_,
                 tag.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    _Var2 = (_Optional_payload_base<unsigned_int>)SVInt::as<unsigned_int>(in_stack_ffffffffffffff78)
    ;
    SVInt::~SVInt(this_00);
    puVar3 = std::optional<unsigned_int>::value(this);
    if (*puVar3 != in_EDX) {
      range.endLoc = (SourceLocation)_Var2;
      range.startLoc = in_stack_ffffffffffffffb0;
      EvalContext::addDiag((EvalContext *)in_stack_ffffffffffffffa8,code,range);
      arg._M_str = (char *)in_stack_ffffffffffffffb0;
      arg._M_len._0_4_ = in_stack_ffffffffffffffa8._M_payload;
      arg._M_len._4_1_ = in_stack_ffffffffffffffa8._M_engaged;
      arg._M_len._5_3_ = in_stack_ffffffffffffffa8._5_3_;
      Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg);
      return false;
    }
  }
  return true;
}

Assistant:

static bool checkPackedUnionTag(const Type& valueType, const SVInt& val, uint32_t expectedTag,
                                EvalContext& context, SourceRange sourceRange,
                                std::string_view memberName) {
    uint32_t tagBits = valueType.as<PackedUnionType>().tagBits;
    if (tagBits) {
        bitwidth_t bits = val.getBitWidth();
        auto tag = val.slice(int32_t(bits - 1), int32_t(bits - tagBits)).as<uint32_t>();
        if (tag.value() != expectedTag) {
            context.addDiag(diag::ConstEvalTaggedUnion, sourceRange) << memberName;
            return false;
        }
    }

    return true;
}